

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

Type * slang::ast::Type::fromSyntax
                 (Compilation *compilation,Type *elementType,
                 SyntaxList<slang::syntax::VariableDimensionSyntax> *dimensions,ASTContext *context)

{
  SourceRange sourceRange;
  ConstantRange dim_00;
  DeferredSourceRange sourceRange_00;
  bool bVar1;
  Type *pTVar2;
  size_type sVar3;
  SourceLocation *pSVar4;
  undefined8 in_RCX;
  long in_RDX;
  AssociativeArrayType *in_RSI;
  Compilation *in_RDI;
  QueueType *next_3;
  AssociativeArrayType *next_2;
  DPIOpenArrayType *next_1;
  DynamicArrayType *next;
  EvaluatedDimension dim;
  VariableDimensionSyntax *syntax;
  size_t i;
  size_t count;
  Type *result;
  Type *in_stack_fffffffffffffee8;
  Type *in_stack_fffffffffffffef0;
  Type *in_stack_fffffffffffffef8;
  BumpAllocator *in_stack_ffffffffffffff00;
  ASTContext *in_stack_ffffffffffffff08;
  SourceLocation in_stack_ffffffffffffff10;
  SourceLocation in_stack_ffffffffffffff18;
  Type *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  Type *local_a8;
  undefined6 local_a0;
  undefined1 in_stack_ffffffffffffff66;
  undefined1 in_stack_ffffffffffffff67;
  Type *in_stack_ffffffffffffff68;
  Scope *in_stack_ffffffffffffff70;
  int32_t in_stack_ffffffffffffff78;
  int32_t in_stack_ffffffffffffff7c;
  undefined4 uStack_80;
  SourceLocation in_stack_ffffffffffffff90;
  SourceLocation node;
  PointerIntPair<const_slang::syntax::SyntaxNode_*,_1U,_1U,_bool> PVar5;
  AssociativeArrayType *local_50;
  bitmask<slang::ast::ASTFlags> local_30;
  DiagCode DStack_24;
  long local_20;
  AssociativeArrayType *local_18;
  Compilation *local_10;
  AssociativeArrayType *local_8;
  
  DStack_24 = SUB84((ulong)in_RCX >> 0x20,0);
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  bVar1 = std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::empty
                    ((span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *)
                     0x4a1f48);
  if (bVar1) {
    local_8 = local_18;
  }
  else {
    pTVar2 = getCanonicalType(in_stack_fffffffffffffef0);
    if ((pTVar2->super_Symbol).kind - UntypedType < 3) {
      bitmask<slang::ast::ASTFlags>::bitmask(&local_30,AllowInterconnect);
      bVar1 = bitmask<slang::ast::ASTFlags>::has
                        ((bitmask<slang::ast::ASTFlags> *)in_stack_ffffffffffffff00,
                         (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffef8);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        slang::syntax::SyntaxNode::sourceRange
                  ((SyntaxNode *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
        sourceRange.endLoc = in_stack_ffffffffffffff18;
        sourceRange.startLoc = in_stack_ffffffffffffff10;
        ASTContext::addDiag(in_stack_ffffffffffffff08,DStack_24,sourceRange);
        ast::operator<<((Diagnostic *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                        in_stack_ffffffffffffff38);
        pTVar2 = Compilation::getErrorType(local_10);
        return pTVar2;
      }
    }
    local_50 = local_18;
    sVar3 = std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::size
                      ((span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *)
                       0x4a206b);
    for (PVar5.value = 0; PVar5.value < sVar3; PVar5.value = PVar5.value + 1) {
      bVar1 = isError((Type *)0x4a20a2);
      if (bVar1) {
        return &local_50->super_Type;
      }
      pSVar4 = (SourceLocation *)
               std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::
               operator[]((span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *)
                          (local_20 + 0x28),~PVar5.value + sVar3);
      node = *pSVar4;
      ASTContext::evalDimension
                ((ASTContext *)in_stack_ffffffffffffff70,
                 (VariableDimensionSyntax *)in_stack_ffffffffffffff68,
                 (bool)in_stack_ffffffffffffff67,(bool)in_stack_ffffffffffffff66);
      switch(in_stack_ffffffffffffff78) {
      case 0:
        pTVar2 = Compilation::getErrorType(local_10);
        return pTVar2;
      case 1:
      case 2:
        not_null<const_slang::ast::Scope_*>::operator*
                  ((not_null<const_slang::ast::Scope_*> *)0x4a2164);
        in_stack_ffffffffffffff70 = (Scope *)CONCAT44(uStack_80,in_stack_ffffffffffffff7c);
        in_stack_fffffffffffffef8 = in_stack_ffffffffffffff68;
        slang::syntax::DeferredSourceRange::DeferredSourceRange
                  ((DeferredSourceRange *)in_stack_fffffffffffffef0,
                   (SyntaxNode *)in_stack_fffffffffffffee8);
        in_stack_fffffffffffffef0 =
             (Type *)CONCAT17(in_stack_ffffffffffffff67,CONCAT16(in_stack_ffffffffffffff66,local_a0)
                             );
        dim_00.right = in_stack_ffffffffffffff7c;
        dim_00.left = in_stack_ffffffffffffff78;
        sourceRange_00.range.endLoc = node;
        sourceRange_00.range.startLoc = in_stack_ffffffffffffff90;
        sourceRange_00.node.value = PVar5.value;
        in_stack_fffffffffffffee8 = local_a8;
        in_stack_ffffffffffffff68 = in_stack_fffffffffffffef8;
        local_50 = (AssociativeArrayType *)
                   FixedSizeUnpackedArrayType::fromDim
                             (in_stack_ffffffffffffff70,in_stack_fffffffffffffef8,dim_00,
                              sourceRange_00);
        break;
      case 3:
        local_50 = (AssociativeArrayType *)
                   BumpAllocator::emplace<slang::ast::DynamicArrayType,slang::ast::Type_const&>
                             ((BumpAllocator *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        Symbol::setSyntax((Symbol *)local_50,(SyntaxNode *)node);
        break;
      case 4:
        local_50 = BumpAllocator::
                   emplace<slang::ast::AssociativeArrayType,slang::ast::Type_const&,slang::ast::Type_const*&>
                             (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                              (Type **)in_stack_fffffffffffffef0);
        Symbol::setSyntax((Symbol *)local_50,(SyntaxNode *)node);
        break;
      case 5:
        local_50 = (AssociativeArrayType *)
                   BumpAllocator::
                   emplace<slang::ast::QueueType,slang::ast::Type_const&,unsigned_int&>
                             (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                              (uint *)in_stack_fffffffffffffef0);
        Symbol::setSyntax((Symbol *)local_50,(SyntaxNode *)node);
        break;
      case 6:
        local_50 = (AssociativeArrayType *)
                   BumpAllocator::emplace<slang::ast::DPIOpenArrayType,slang::ast::Type_const&,bool>
                             (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                              (bool *)in_stack_fffffffffffffef0);
        Symbol::setSyntax((Symbol *)local_50,(SyntaxNode *)node);
      }
    }
    local_8 = local_50;
  }
  return &local_8->super_Type;
}

Assistant:

const Type& Type::fromSyntax(Compilation& compilation, const Type& elementType,
                             const SyntaxList<VariableDimensionSyntax>& dimensions,
                             const ASTContext& context) {
    if (dimensions.empty())
        return elementType;

    switch (elementType.getCanonicalType().kind) {
        case SymbolKind::SequenceType:
        case SymbolKind::PropertyType:
        case SymbolKind::UntypedType:
            if (!context.flags.has(ASTFlags::AllowInterconnect)) {
                context.addDiag(diag::InvalidArrayElemType, dimensions.sourceRange())
                    << elementType;
                return compilation.getErrorType();
            }
            break;
        default:
            break;
    }

    const Type* result = &elementType;
    size_t count = dimensions.size();
    for (size_t i = 0; i < count; i++) {
        if (result->isError())
            return *result;

        auto& syntax = *dimensions[count - i - 1];
        auto dim = context.evalDimension(syntax, /* requireRange */ false, /* isPacked */ false);

        switch (dim.kind) {
            case DimensionKind::Unknown:
                return compilation.getErrorType();
            case DimensionKind::Range:
            case DimensionKind::AbbreviatedRange:
                result = &FixedSizeUnpackedArrayType::fromDim(*context.scope, *result, dim.range,
                                                              syntax);
                break;
            case DimensionKind::Dynamic: {
                auto next = compilation.emplace<DynamicArrayType>(*result);
                next->setSyntax(syntax);
                result = next;
                break;
            }
            case DimensionKind::DPIOpenArray: {
                auto next = compilation.emplace<DPIOpenArrayType>(*result, /* isPacked */ false);
                next->setSyntax(syntax);
                result = next;
                break;
            }
            case DimensionKind::Associative: {
                auto next = compilation.emplace<AssociativeArrayType>(*result, dim.associativeType);
                next->setSyntax(syntax);
                result = next;
                break;
            }
            case DimensionKind::Queue: {
                auto next = compilation.emplace<QueueType>(*result, dim.queueMaxSize);
                next->setSyntax(syntax);
                result = next;
                break;
            }
        }
    }

    return *result;
}